

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenDDLCommon.cpp
# Opt level: O3

void __thiscall ODDLParser::Name::Name(Name *this,Name *name)

{
  size_t numChars;
  char *buffer;
  Text *this_00;
  
  this->m_type = name->m_type;
  this_00 = (Text *)operator_new(0x18);
  numChars = name->m_id->m_len;
  buffer = name->m_id->m_buffer;
  this_00->m_capacity = 0;
  this_00->m_len = 0;
  this_00->m_buffer = (char *)0x0;
  Text::set(this_00,buffer,numChars);
  this->m_id = this_00;
  return;
}

Assistant:

Name::Name( const Name &name ){
    m_type=name.m_type;
    m_id=new Text(name.m_id->m_buffer,name.m_id->m_len);
}